

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateSymbolImports
          (EnumGenerator *this,Printer *printer)

{
  Options *this_00;
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  Options *pOVar4;
  EnumValueDescriptor *pEVar5;
  FileDescriptor *file;
  EnumValueDescriptor *enum_value;
  string local_a8;
  EnumValueDescriptor *local_88;
  undefined1 local_80 [8];
  string deprecated_attr;
  int j;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  Formatter::operator()<>((Formatter *)local_50,"typedef $classname$ $resolved_name$;\n");
  deprecated_attr.field_2._8_4_ = 0;
  while( true ) {
    uVar1 = deprecated_attr.field_2._8_4_;
    uVar3 = EnumDescriptor::value_count(this->descriptor_);
    pEVar5 = (EnumValueDescriptor *)(ulong)uVar3;
    if ((int)uVar3 <= (int)uVar1) break;
    this_00 = this->options_;
    pOVar4 = (Options *)EnumDescriptor::value(this->descriptor_,deprecated_attr.field_2._8_4_);
    DeprecatedAttribute_abi_cxx11_((string *)local_80,(cpp *)this_00,pOVar4,pEVar5);
    local_88 = EnumDescriptor::value(this->descriptor_,deprecated_attr.field_2._8_4_);
    pEVar5 = EnumDescriptor::value(this->descriptor_,deprecated_attr.field_2._8_4_);
    EnumValueName_abi_cxx11_(&local_a8,(cpp *)pEVar5,enum_value);
    Formatter::operator()
              ((Formatter *)local_50,
               "$1$static constexpr $resolved_name$ ${2$$3$$}$ =\n  $classname$_$3$;\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               &local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)local_80);
    deprecated_attr.field_2._8_4_ = deprecated_attr.field_2._8_4_ + 1;
  }
  Formatter::operator()
            ((Formatter *)local_50,
             "static inline bool $nested_name$_IsValid(int value) {\n  return $classname$_IsValid(value);\n}\nstatic constexpr $resolved_name$ ${1$$nested_name$_MIN$}$ =\n  $classname$_$nested_name$_MIN;\nstatic constexpr $resolved_name$ ${1$$nested_name$_MAX$}$ =\n  $classname$_$nested_name$_MAX;\n"
             ,&this->descriptor_);
  if ((this->generate_array_size_ & 1U) != 0) {
    Formatter::operator()
              ((Formatter *)local_50,
               "static constexpr int ${1$$nested_name$_ARRAYSIZE$}$ =\n  $classname$_$nested_name$_ARRAYSIZE;\n"
               ,&this->descriptor_);
  }
  file = EnumDescriptor::file(this->descriptor_);
  bVar2 = HasDescriptorMethods(file,this->options_);
  if (bVar2) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "static inline const ::$proto_ns$::EnumDescriptor*\n$nested_name$_descriptor() {\n  return $classname$_descriptor();\n}\n"
              );
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "template<typename T>\nstatic inline const std::string& $nested_name$_Name(T enum_t_value) {\n  static_assert(::std::is_same<T, $resolved_name$>::value ||\n    ::std::is_integral<T>::value,\n    \"Incorrect type passed to function $nested_name$_Name.\");\n  return $classname$_Name(enum_t_value);\n}\n"
            );
  Formatter::operator()<>
            ((Formatter *)local_50,
             "static inline bool $nested_name$_Parse(::PROTOBUF_NAMESPACE_ID::ConstStringParam name,\n    $resolved_name$* value) {\n  return $classname$_Parse(name, value);\n}\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void EnumGenerator::GenerateSymbolImports(io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("typedef $classname$ $resolved_name$;\n");

  for (int j = 0; j < descriptor_->value_count(); j++) {
    std::string deprecated_attr =
        DeprecatedAttribute(options_, descriptor_->value(j));
    format(
        "$1$static constexpr $resolved_name$ ${2$$3$$}$ =\n"
        "  $classname$_$3$;\n",
        deprecated_attr, descriptor_->value(j),
        EnumValueName(descriptor_->value(j)));
  }

  format(
      "static inline bool $nested_name$_IsValid(int value) {\n"
      "  return $classname$_IsValid(value);\n"
      "}\n"
      "static constexpr $resolved_name$ ${1$$nested_name$_MIN$}$ =\n"
      "  $classname$_$nested_name$_MIN;\n"
      "static constexpr $resolved_name$ ${1$$nested_name$_MAX$}$ =\n"
      "  $classname$_$nested_name$_MAX;\n",
      descriptor_);
  if (generate_array_size_) {
    format(
        "static constexpr int ${1$$nested_name$_ARRAYSIZE$}$ =\n"
        "  $classname$_$nested_name$_ARRAYSIZE;\n",
        descriptor_);
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "static inline const ::$proto_ns$::EnumDescriptor*\n"
        "$nested_name$_descriptor() {\n"
        "  return $classname$_descriptor();\n"
        "}\n");
  }

  format(
      "template<typename T>\n"
      "static inline const std::string& $nested_name$_Name(T enum_t_value) {\n"
      "  static_assert(::std::is_same<T, $resolved_name$>::value ||\n"
      "    ::std::is_integral<T>::value,\n"
      "    \"Incorrect type passed to function $nested_name$_Name.\");\n"
      "  return $classname$_Name(enum_t_value);\n"
      "}\n");
  format(
      "static inline bool "
      "$nested_name$_Parse(::PROTOBUF_NAMESPACE_ID::ConstStringParam name,\n"
      "    $resolved_name$* value) {\n"
      "  return $classname$_Parse(name, value);\n"
      "}\n");
}